

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::setComment(Value *this,char *comment,CommentPlacement placement)

{
  undefined8 *puVar1;
  CommentInfo *local_40;
  CommentPlacement placement_local;
  char *comment_local;
  Value *this_local;
  
  if (this->comments_ == (CommentInfo *)0x0) {
    puVar1 = (undefined8 *)operator_new__(0x20);
    *puVar1 = 3;
    local_40 = (CommentInfo *)(puVar1 + 1);
    do {
      CommentInfo::CommentInfo(local_40);
      local_40 = local_40 + 1;
    } while (local_40 != (CommentInfo *)(puVar1 + 4));
    this->comments_ = (CommentInfo *)(puVar1 + 1);
  }
  CommentInfo::setComment(this->comments_ + placement,comment);
  return;
}

Assistant:

void Value::setComment(const char* comment, CommentPlacement placement) {
  if (!comments_)
    comments_ = new CommentInfo[numberOfCommentPlacement];
  comments_[placement].setComment(comment);
}